

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

void mbedtls_ssl_config_free(mbedtls_ssl_config *conf)

{
  uchar *puVar1;
  size_t sVar2;
  mbedtls_ssl_key_cert *pmVar3;
  mbedtls_ssl_key_cert *__ptr;
  long lVar4;
  size_t sVar5;
  
  mbedtls_mpi_free(&conf->dhm_P);
  mbedtls_mpi_free(&conf->dhm_G);
  puVar1 = conf->psk;
  if (puVar1 != (uchar *)0x0) {
    sVar2 = conf->psk_len;
    if (sVar2 != 0) {
      sVar5 = 0;
      do {
        puVar1[sVar5] = '\0';
        sVar5 = sVar5 + 1;
      } while (sVar2 != sVar5);
    }
    sVar2 = conf->psk_identity_len;
    if (sVar2 != 0) {
      puVar1 = conf->psk_identity;
      sVar5 = 0;
      do {
        puVar1[sVar5] = '\0';
        sVar5 = sVar5 + 1;
      } while (sVar2 != sVar5);
    }
    free(conf->psk);
    free(conf->psk_identity);
    conf->psk_len = 0;
    conf->psk_identity_len = 0;
  }
  __ptr = conf->key_cert;
  while (__ptr != (mbedtls_ssl_key_cert *)0x0) {
    pmVar3 = __ptr->next;
    free(__ptr);
    __ptr = pmVar3;
  }
  lVar4 = 0;
  do {
    *(undefined1 *)((long)conf->ciphersuite_list + lVar4) = 0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x178);
  return;
}

Assistant:

void mbedtls_ssl_config_free( mbedtls_ssl_config *conf )
{
#if defined(MBEDTLS_DHM_C)
    mbedtls_mpi_free( &conf->dhm_P );
    mbedtls_mpi_free( &conf->dhm_G );
#endif

#if defined(MBEDTLS_KEY_EXCHANGE__SOME__PSK_ENABLED)
    if( conf->psk != NULL )
    {
        mbedtls_zeroize( conf->psk, conf->psk_len );
        mbedtls_zeroize( conf->psk_identity, conf->psk_identity_len );
        mbedtls_free( conf->psk );
        mbedtls_free( conf->psk_identity );
        conf->psk_len = 0;
        conf->psk_identity_len = 0;
    }
#endif

#if defined(MBEDTLS_X509_CRT_PARSE_C)
    ssl_key_cert_free( conf->key_cert );
#endif

    mbedtls_zeroize( conf, sizeof( mbedtls_ssl_config ) );
}